

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_subcommand
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_t sVar1;
  undefined8 uVar2;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_RSI;
  App *in_RDI;
  App *parent_app;
  size_type dotloc;
  App *com;
  value_type *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  App *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  App *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff58;
  HorribleError *in_stack_ffffffffffffff60;
  App *pAVar3;
  undefined1 in_stack_ffffffffffffff87;
  undefined8 in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [2];
  size_type local_28;
  App *local_20;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  sVar1 = _count_remaining_positionals(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
  if (sVar1 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffef0);
    local_20 = _find_subcommand(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                (bool)in_stack_ffffffffffffff3f,(bool)in_stack_ffffffffffffff3e);
    if (local_20 == (App *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffef0);
      local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of(in_stack_fffffffffffffef0,
                               (char)((ulong)in_stack_fffffffffffffee8 >> 0x38),0x1d203b);
      if (local_28 != 0xffffffffffffffff) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffef0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00,
                   (size_type)in_stack_fffffffffffffef8);
        local_20 = _find_subcommand(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                    (bool)in_stack_ffffffffffffff3f,(bool)in_stack_ffffffffffffff3e)
        ;
        ::std::__cxx11::string::~string(in_stack_fffffffffffffef0);
        if (local_20 != (App *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffef0);
          in_stack_fffffffffffffef8 = local_68;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00,
                     (size_type)in_stack_fffffffffffffef8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffef0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_ffffffffffffff40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
          ::std::__cxx11::string::~string(in_stack_fffffffffffffef0);
          in_stack_ffffffffffffff08 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff78;
          in_stack_ffffffffffffff00 = local_18;
          get_display_name_abi_cxx11_
                    ((App *)in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffef0);
        }
      }
    }
    if (local_20 == (App *)0x0) {
      if (in_RDI->parent_ == (App *)0x0) {
        uVar2 = __cxa_allocate_exception(0x38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffef0);
        ::std::operator+((char *)CONCAT17(in_stack_ffffffffffffff3f,
                                          CONCAT16(in_stack_ffffffffffffff3e,
                                                   in_stack_ffffffffffffff38)),
                         in_stack_ffffffffffffff30);
        ::std::operator+(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
        HorribleError::HorribleError(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        __cxa_throw(uVar2,&HorribleError::typeinfo,HorribleError::~HorribleError);
      }
      local_1 = false;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1d219f);
      if ((local_20->silent_ & 1U) == 0) {
        std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                  (in_stack_ffffffffffffff00,(value_type *)in_stack_fffffffffffffef8);
      }
      _parse(in_RDI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff08);
      for (pAVar3 = local_20->parent_; pAVar3 != in_RDI; pAVar3 = pAVar3->parent_) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_18);
        _trigger_pre_parse(in_stack_ffffffffffffff20,
                           CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        if ((local_20->silent_ & 1U) == 0) {
          std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                    (in_stack_ffffffffffffff00,(value_type *)in_stack_fffffffffffffef8);
        }
      }
      local_1 = true;
    }
  }
  else {
    _parse_positional(this,args,com._7_1_);
    local_1 = true;
  }
  return local_1;
}

Assistant:

CLI11_INLINE bool App::_parse_subcommand(std::vector<std::string> &args) {
    if(_count_remaining_positionals(/* required */ true) > 0) {
        _parse_positional(args, false);
        return true;
    }
    auto *com = _find_subcommand(args.back(), true, true);
    if(com == nullptr) {
        // the main way to get here is using .notation
        auto dotloc = args.back().find_first_of('.');
        if(dotloc != std::string::npos) {
            com = _find_subcommand(args.back().substr(0, dotloc), true, true);
            if(com != nullptr) {
                args.back() = args.back().substr(dotloc + 1);
                args.push_back(com->get_display_name());
            }
        }
    }
    if(com != nullptr) {
        args.pop_back();
        if(!com->silent_) {
            parsed_subcommands_.push_back(com);
        }
        com->_parse(args);
        auto *parent_app = com->parent_;
        while(parent_app != this) {
            parent_app->_trigger_pre_parse(args.size());
            if(!com->silent_) {
                parent_app->parsed_subcommands_.push_back(com);
            }
            parent_app = parent_app->parent_;
        }
        return true;
    }

    if(parent_ == nullptr)
        throw HorribleError("Subcommand " + args.back() + " missing");
    return false;
}